

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

DistanceType __thiscall
nanoflann::
L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>
::evalMetric(L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>
             *this,float *a,uint b_idx,size_t size,DistanceType worst_dist)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  int dim;
  ulong idx;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_54;
  
  pfVar1 = a + size;
  pfVar5 = a + (size - 3);
  idx = (ulong)b_idx;
  dim = 0;
  local_54 = 0.0;
  do {
    if (pfVar5 <= a) {
      for (; a < pfVar1; a = a + 1) {
        fVar2 = *a;
        fVar10 = eos::fitting::
                 KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
                 ::kdtree_get_pt(this->data_source,idx,dim);
        local_54 = local_54 + (fVar2 - fVar10) * (fVar2 - fVar10);
        dim = dim + 1;
      }
      return local_54;
    }
    fVar2 = *a;
    fVar6 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,idx,dim);
    fVar10 = a[1];
    fVar7 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,idx,dim + 1);
    fVar3 = a[2];
    fVar8 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,idx,dim + 2);
    fVar4 = a[3];
    fVar9 = eos::fitting::
            KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>
            ::kdtree_get_pt(this->data_source,idx,dim + 3);
    a = a + 4;
    dim = dim + 4;
    local_54 = local_54 +
               (fVar4 - fVar9) * (fVar4 - fVar9) +
               (fVar3 - fVar8) * (fVar3 - fVar8) +
               (fVar2 - fVar6) * (fVar2 - fVar6) + (fVar10 - fVar7) * (fVar10 - fVar7);
  } while ((worst_dist <= 0.0) || (local_54 <= worst_dist));
  return local_54;
}

Assistant:

inline DistanceType evalMetric(
        const T* a, const AccessorType b_idx, size_t size,
        DistanceType worst_dist = -1) const
    {
        DistanceType result    = DistanceType();
        const T*     last      = a + size;
        const T*     lastgroup = last - 3;
        size_t       d         = 0;

        /* Process 4 items with each loop for efficiency. */
        while (a < lastgroup)
        {
            const DistanceType diff0 =
                a[0] - data_source.kdtree_get_pt(b_idx, d++);
            const DistanceType diff1 =
                a[1] - data_source.kdtree_get_pt(b_idx, d++);
            const DistanceType diff2 =
                a[2] - data_source.kdtree_get_pt(b_idx, d++);
            const DistanceType diff3 =
                a[3] - data_source.kdtree_get_pt(b_idx, d++);
            result +=
                diff0 * diff0 + diff1 * diff1 + diff2 * diff2 + diff3 * diff3;
            a += 4;
            if ((worst_dist > 0) && (result > worst_dist)) { return result; }
        }
        /* Process last 0-3 components.  Not needed for standard vector lengths.
         */
        while (a < last)
        {
            const DistanceType diff0 =
                *a++ - data_source.kdtree_get_pt(b_idx, d++);
            result += diff0 * diff0;
        }
        return result;
    }